

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  uint8_t prev_byte2;
  uint8_t prev_byte;
  uint32_t uVar1;
  uint32_t *puVar2;
  H10 *p;
  int iVar3;
  ulong uVar4;
  BrotliEncoderState *s;
  ulong uVar5;
  ZopfliNode *array;
  ulong uVar6;
  size_t sVar7;
  Command *cmds;
  uint8_t *puVar8;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  char cVar9;
  uint uVar10;
  uint8_t *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t bytes;
  size_t __n;
  ContextType literal_context_mode;
  long lVar16;
  ulong uVar17;
  size_t n;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  bool bVar28;
  int in_stack_fffffffffffffd58;
  Command *local_2a0;
  ulong local_290;
  ulong *local_288;
  size_t local_280;
  ulong local_278;
  H10 *local_270;
  ulong local_268;
  undefined8 local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  MemoryManager memory_manager;
  int dist_cache [4];
  ulong local_200;
  size_t num_literals;
  int saved_dist_cache [4];
  uint8_t *local_1c0;
  size_t last_insert_len;
  uint8_t *next_in;
  int local_168;
  uint local_164;
  size_t local_160;
  int local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  size_t local_128;
  ulong local_120;
  ulong local_118;
  size_t available_in;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  local_268 = *encoded_size;
  if (input_size == 0) {
    if (local_268 == 0) {
      return 0;
    }
    *encoded_size = 1;
    *encoded_buffer = '\x06';
  }
  else {
    uVar4 = ((input_size + (input_size >> 0x18) * 4) -
            (ulong)(((uint)input_size & 0xffffff) < 0x100001)) + 7;
    uVar5 = 0;
    if (input_size <= uVar4) {
      uVar5 = uVar4;
    }
    if (local_268 == 0) {
      return 0;
    }
    local_288 = encoded_size;
    local_280 = input_size;
    if (quality == 10) {
      uVar10 = 0x10;
      if (0x10 < lgwin) {
        uVar10 = lgwin;
      }
      uVar4 = 0x18;
      if ((int)uVar10 < 0x18) {
        uVar4 = (ulong)uVar10;
      }
      uVar22 = 1;
      iVar3 = (int)uVar4;
      uVar15 = 1L << ((byte)uVar4 & 0x3f);
      dist_cache[0] = 4;
      dist_cache[1] = 0xb;
      dist_cache[2] = 0xf;
      dist_cache[3] = 0x10;
      uVar23 = uVar15;
      if (input_size < uVar15) {
        uVar23 = input_size;
      }
      cVar9 = '\x17';
      if ((int)uVar10 < 0x17) {
        cVar9 = (char)uVar10;
      }
      uVar13 = 1L << (cVar9 + 1U & 0x3f);
      saved_dist_cache[0] = 4;
      saved_dist_cache[1] = 0xb;
      saved_dist_cache[2] = 0xf;
      saved_dist_cache[3] = 0x10;
      next_in = (uint8_t *)0xa00000000;
      local_160 = 0;
      local_158 = 0;
      local_164 = 0x12;
      if ((int)uVar10 < 0x12) {
        local_164 = uVar10;
      }
      local_148 = 1L << ((byte)local_164 & 0x3f);
      local_168 = iVar3;
      local_150 = uVar5;
      BrotliInitMemoryManager
                (&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      uVar6 = local_268;
      if (0x8000000000000000 < input_size) {
        __assert_fail("input_size <= mask + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                      ,0x429,
                      "int BrotliCompressBufferQuality10(int, size_t, const uint8_t *, size_t *, uint8_t *)"
                     );
      }
      if (iVar3 == 0x10) {
        local_260 = 0;
      }
      else if (iVar3 == 0x11) {
        uVar22 = 7;
        local_260 = 0x8000000000000001;
      }
      else {
        local_260 = CONCAT71((int7)(uVar4 >> 8),(byte)uVar4 * '\x02' + -0x21);
        uVar22 = 4;
      }
      uVar5 = uVar13 >> 3;
      local_270 = (H10 *)BrotliAllocate(&memory_manager,0x80028);
      local_270->forest_ = (uint32_t *)0x0;
      local_270->forest_size_ = 0;
      local_270->is_dirty_ = 1;
      InitH10(&memory_manager,local_270,(uint8_t *)&next_in,(BrotliEncoderParams *)0x0,uVar23,1,
              in_stack_fffffffffffffd58);
      local_1c0 = encoded_buffer;
      local_258 = 0;
      sVar27 = 0;
      prev_byte = '\0';
      prev_byte2 = '\0';
      do {
        uVar4 = sVar27 + uVar13;
        if (input_size < uVar4) {
          uVar4 = input_size;
        }
        last_insert_len = 0;
        num_literals = 0;
        if (sVar27 < uVar4) {
          local_140 = (uVar4 - sVar27) / 0xc + 0x10;
          local_2a0 = (Command *)0x0;
          local_200 = 0;
          bytes = 0;
          sVar7 = 0;
          local_278 = sVar27;
          local_138 = uVar4;
          do {
            uVar4 = local_138 - sVar27;
            if (local_148 <= local_138 - sVar27) {
              uVar4 = local_148;
            }
            local_130 = sVar7;
            local_128 = bytes;
            array = (ZopfliNode *)BrotliAllocate(&memory_manager,(uVar4 + 1) * 0x10);
            BrotliInitZopfliNodes(array,uVar4 + 1);
            local_250 = uVar4;
            local_248 = sVar27;
            if (0x7f < sVar27 && 2 < uVar4) {
              uVar23 = sVar27 - 0x7f;
              local_120 = (uVar4 + sVar27) - 0x7f;
              if (sVar27 < local_120) {
                local_120 = sVar27;
              }
              if (uVar23 < local_120) {
                uVar4 = local_270->window_mask_;
                do {
                  uVar6 = local_248 - uVar23;
                  if (uVar6 < 0x10) {
                    uVar6 = 0xf;
                  }
                  uVar10 = (uint)(*(int *)(input_buffer + (uVar23 & 0x7fffffffffffffff)) *
                                 0x1e35a7bd) >> 0xf;
                  uVar25 = (ulong)local_270->buckets_[uVar10];
                  local_238 = (uVar23 & uVar4) * 2 + 1;
                  local_240 = (uVar23 & uVar4) * 2;
                  local_270->buckets_[uVar10] = (uint32_t)uVar23;
                  if (uVar23 != uVar25) {
                    local_118 = uVar4 - uVar6;
                    lVar16 = 0x40;
                    uVar6 = 0;
                    uVar18 = 0;
LAB_0012d5e8:
                    bVar28 = lVar16 != 0;
                    lVar16 = lVar16 + -1;
                    if ((uVar23 - uVar25 <= local_118) && (bVar28)) {
                      uVar26 = uVar6;
                      if (uVar18 < uVar6) {
                        uVar26 = uVar18;
                      }
                      if (0x80 < uVar26) {
                        __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                      ,0x9d,
                                      "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                                     );
                      }
                      puVar8 = input_buffer + uVar25;
                      puVar11 = puVar8 + uVar26;
                      uVar14 = 0x80 - uVar26;
                      if (uVar26 < 0x79) {
                        uVar20 = (ulong)((uint)uVar14 & 0xf8);
                        lVar21 = 0;
                        uVar19 = 0;
LAB_0012d66d:
                        if (*(ulong *)(puVar11 + uVar19 * 8) ==
                            *(ulong *)(input_buffer +
                                      uVar19 * 8 + uVar26 + (uVar23 & 0x7fffffffffffffff)))
                        goto code_r0x0012d67a;
                        uVar19 = *(ulong *)(input_buffer +
                                           uVar19 * 8 + uVar26 + (uVar23 & 0x7fffffffffffffff)) ^
                                 *(ulong *)(puVar11 + uVar19 * 8);
                        uVar14 = 0;
                        if (uVar19 != 0) {
                          for (; (uVar19 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                          }
                        }
                        uVar19 = (uVar14 >> 3 & 0x1fffffff) - lVar21;
                        goto LAB_0012d6a4;
                      }
                      uVar20 = 0;
                      goto LAB_0012d747;
                    }
                  }
LAB_0012d56d:
                  uVar1 = local_270->invalid_pos_;
                  puVar2 = local_270->forest_;
                  puVar2[local_240] = uVar1;
                  puVar2[local_238] = uVar1;
LAB_0012d58f:
                  uVar23 = uVar23 + 1;
                } while (uVar23 != local_120);
              }
            }
            uVar4 = local_248;
            sVar7 = BrotliZopfliComputeShortestPath
                              (&memory_manager,local_250,local_248,input_buffer,0x7fffffffffffffff,
                               (BrotliEncoderParams *)&next_in,uVar15 - 0x10,dist_cache,local_270,
                               array);
            uVar23 = local_130;
            uVar6 = sVar7 + local_130 + 1;
            if (uVar6 < local_140) {
              uVar6 = local_140;
            }
            cmds = local_2a0;
            if ((local_200 != uVar6) &&
               (cmds = (Command *)BrotliAllocate(&memory_manager,uVar6 << 4), uVar4 = local_248,
               local_200 = uVar6, local_2a0 != (Command *)0x0)) {
              memcpy(cmds,local_2a0,uVar23 << 4);
              BrotliFree(&memory_manager,local_2a0);
              uVar4 = local_248;
            }
            uVar6 = local_250;
            sVar7 = sVar7 + uVar23;
            BrotliZopfliCreateCommands
                      (local_250,uVar4,uVar15 - 0x10,array,dist_cache,&last_insert_len,cmds + uVar23
                       ,&num_literals);
            bytes = local_128 + uVar6;
            BrotliFree(&memory_manager,array);
            local_2a0 = cmds;
          } while (((sVar7 <= uVar5) && (num_literals <= uVar5)) &&
                  (sVar27 = uVar4 + local_250, sVar27 < local_138));
          if (last_insert_len != 0) {
            cmds[sVar7].insert_len_ = (uint32_t)last_insert_len;
            cmds[sVar7].copy_len_ = 0x4000000;
            cmds[sVar7].dist_extra_ = 0;
            cmds[sVar7].dist_prefix_ = 0x10;
            if (last_insert_len < 6) {
              uVar4 = last_insert_len & 0xffffffff;
            }
            else if (last_insert_len < 0x82) {
              uVar10 = 0x1f;
              uVar12 = (uint)(last_insert_len - 2);
              if (uVar12 != 0) {
                for (; uVar12 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar4 = (ulong)((int)(last_insert_len - 2 >>
                                   ((char)(uVar10 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                              (uVar10 ^ 0xffffffe0) * 2 + 0x40);
            }
            else if (last_insert_len < 0x842) {
              uVar12 = (uint32_t)last_insert_len - 0x42;
              uVar10 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar4 = (ulong)((uVar10 ^ 0xffe0) + 0x2a);
            }
            else {
              uVar4 = 0x15;
              if (0x1841 < last_insert_len) {
                uVar4 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
              }
            }
            cmds[sVar7].cmd_prefix_ =
                 (short)uVar4 * 8 & 0x38U |
                 *(ushort *)
                  (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar4 & 0xffff) >> 3) * 3) * 2) |
                 2;
            num_literals = num_literals + last_insert_len;
            sVar7 = sVar7 + 1;
          }
          sVar27 = bytes + local_278;
          bVar28 = sVar27 == local_280;
          uVar6 = local_268;
          input_size = local_280;
          if (bytes == 0) goto LAB_0012dcec;
          local_290 = uVar22;
          iVar3 = ShouldCompress(input_buffer,0x7fffffffffffffff,local_278,bytes,num_literals,sVar7)
          ;
          if (iVar3 == 0) {
            dist_cache[0] = saved_dist_cache[0];
            dist_cache[1] = saved_dist_cache[1];
            dist_cache[2] = saved_dist_cache[2];
            dist_cache[3] = saved_dist_cache[3];
            puVar8 = (uint8_t *)BrotliAllocate(&memory_manager,bytes + 0x10);
            *puVar8 = (uint8_t)local_260;
            BrotliStoreUncompressedMetaBlock
                      ((uint)bVar28,input_buffer,local_278,0x7fffffffffffffff,bytes,&local_290,
                       puVar8);
            uVar4 = extraout_RAX_00;
            uVar6 = local_268;
            input_size = local_280;
          }
          else {
            BrotliInitBlockSplit((BlockSplit *)&available_in);
            BrotliInitBlockSplit(&local_e0);
            BrotliInitBlockSplit(&local_b0);
            uVar4 = local_278;
            local_40 = (HistogramDistance *)0x0;
            sStack_38 = 0;
            local_50 = (HistogramCommand *)0x0;
            sStack_48 = 0;
            local_60 = (HistogramLiteral *)0x0;
            sStack_58 = 0;
            local_70 = (uint32_t *)0x0;
            sStack_68 = 0;
            local_80 = (uint32_t *)0x0;
            sStack_78 = 0;
            iVar3 = BrotliIsMostlyUTF8(input_buffer,local_278,0x7fffffffffffffff,bytes,0.75);
            literal_context_mode = (iVar3 == 0) + CONTEXT_UTF8;
            BrotliBuildMetaBlock
                      (&memory_manager,input_buffer,uVar4,0x7fffffffffffffff,
                       (BrotliEncoderParams *)&next_in,prev_byte,prev_byte2,cmds,sVar7,
                       literal_context_mode,(MetaBlockSplit *)&available_in);
            BrotliOptimizeHistograms(0,0,(MetaBlockSplit *)&available_in);
            puVar8 = (uint8_t *)0x0;
            n = bytes * 2 + 0x1f6;
            if (n != 0) {
              puVar8 = (uint8_t *)BrotliAllocate(&memory_manager,n);
            }
            uVar24 = (uint8_t)local_260;
            *puVar8 = uVar24;
            BrotliStoreMetaBlock
                      (&memory_manager,input_buffer,local_278,bytes,0x7fffffffffffffff,prev_byte,
                       prev_byte2,(uint)bVar28,0,0,literal_context_mode,cmds,sVar7,
                       (MetaBlockSplit *)&available_in,&local_290,puVar8);
            if (bytes + 4 < local_290 >> 3) {
              dist_cache[0] = saved_dist_cache[0];
              dist_cache[1] = saved_dist_cache[1];
              dist_cache[2] = saved_dist_cache[2];
              dist_cache[3] = saved_dist_cache[3];
              *puVar8 = uVar24;
              local_290 = uVar22;
              BrotliStoreUncompressedMetaBlock
                        ((uint)bVar28,input_buffer,local_278,0x7fffffffffffffff,bytes,&local_290,
                         puVar8);
            }
            BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
            BrotliDestroyBlockSplit(&memory_manager,&local_e0);
            BrotliDestroyBlockSplit(&memory_manager,&local_b0);
            BrotliFree(&memory_manager,local_80);
            local_80 = (uint32_t *)0x0;
            BrotliFree(&memory_manager,local_70);
            local_70 = (uint32_t *)0x0;
            BrotliFree(&memory_manager,local_60);
            local_60 = (HistogramLiteral *)0x0;
            BrotliFree(&memory_manager,local_50);
            local_50 = (HistogramCommand *)0x0;
            BrotliFree(&memory_manager,local_40);
            uVar4 = extraout_RAX;
            uVar6 = local_268;
            input_size = local_280;
          }
        }
        else {
          local_2a0 = (Command *)0x0;
LAB_0012dcec:
          local_290 = uVar22;
          puVar8 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
          *puVar8 = (uint8_t)local_260;
          *(ulong *)(puVar8 + (local_290 >> 3)) =
               3L << ((byte)local_290 & 7) | (ulong)puVar8[local_290 >> 3];
          uVar4 = (ulong)((int)local_290 + 9U & 0xfffffff8);
          local_290 = uVar4;
        }
        uVar23 = local_290;
        uVar22 = local_290 >> 3;
        local_260 = CONCAT71((int7)(uVar4 >> 8),puVar8[uVar22]);
        prev_byte2 = input_buffer[sVar27 - 2];
        prev_byte = input_buffer[sVar27 - 1];
        saved_dist_cache[0] = dist_cache[0];
        saved_dist_cache[1] = dist_cache[1];
        saved_dist_cache[2] = dist_cache[2];
        saved_dist_cache[3] = dist_cache[3];
        local_258 = local_258 + uVar22;
        if (local_258 <= uVar6) {
          memcpy(local_1c0,puVar8,uVar22);
          local_1c0 = local_1c0 + uVar22;
          uVar6 = local_268;
        }
        BrotliFree(&memory_manager,puVar8);
        BrotliFree(&memory_manager,local_2a0);
        uVar4 = local_258;
        p = local_270;
      } while ((local_258 <= uVar6) && (uVar22 = (ulong)((uint)uVar23 & 7), sVar27 < input_size));
      *local_288 = local_258;
      BrotliFree(&memory_manager,local_270->forest_);
      p->forest_ = (uint32_t *)0x0;
      BrotliFree(&memory_manager,p);
      uVar5 = local_150;
      if (uVar4 <= uVar6) {
        if (local_150 == 0) {
          return 1;
        }
        if (*local_288 <= local_150) {
          return 1;
        }
      }
    }
    else {
      s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if (s == (BrotliEncoderState *)0x0) {
        return 0;
      }
      available_in = local_280;
      memory_manager.alloc_func = (brotli_alloc_func)*local_288;
      dist_cache._0_8_ = encoded_buffer;
      saved_dist_cache[0] = 0;
      saved_dist_cache[1] = 0;
      if (s->is_initialized_ == 0) {
        (s->params).quality = quality;
        (s->params).lgwin = lgwin;
        (s->params).mode = mode;
        (s->params).size_hint = local_280 & 0xffffffff;
      }
      next_in = input_buffer;
      iVar3 = BrotliEncoderCompressStream
                        (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,(size_t *)&memory_manager,
                         (uint8_t **)dist_cache,(size_t *)saved_dist_cache);
      if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
        iVar3 = 0;
      }
      *local_288 = saved_dist_cache._0_8_;
      BrotliEncoderDestroyInstance(s);
      if (iVar3 != 0) {
        if (uVar5 == 0) {
          return 1;
        }
        if (*local_288 <= uVar5) {
          return 1;
        }
      }
    }
    *local_288 = 0;
    if (local_268 <= uVar5 - 1) {
      return 0;
    }
    encoded_buffer[0] = '!';
    encoded_buffer[1] = '\x03';
    lVar16 = 2;
    lVar21 = 0;
    sVar27 = local_280;
    do {
      __n = 0x1000000;
      if (sVar27 < 0x1000000) {
        __n = sVar27;
      }
      iVar3 = 2 - (uint)(sVar27 < 0x100001);
      if (sVar27 < 0x10001) {
        iVar3 = 0;
      }
      uVar12 = ((int)__n * 8 + iVar3 * 2) - 8;
      uVar10 = 0x80000 << ((byte)(iVar3 << 2) & 0x1f) | uVar12;
      encoded_buffer[lVar16] = (uint8_t)uVar12;
      encoded_buffer[lVar16 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
      encoded_buffer[lVar16 + 2] = (uint8_t)(uVar10 >> 0x10);
      if (sVar27 < 0x100001) {
        lVar16 = lVar16 + 3;
      }
      else {
        encoded_buffer[lVar16 + 3] = (uint8_t)(uVar10 >> 0x18);
        lVar16 = lVar16 + 4;
      }
      memcpy(encoded_buffer + lVar16,input_buffer + lVar21,__n);
      lVar16 = lVar16 + __n;
      lVar21 = lVar21 + __n;
      sVar27 = sVar27 - __n;
    } while (sVar27 != 0);
    encoded_buffer[lVar16] = '\x03';
    *local_288 = lVar16 + 1;
  }
  return 1;
code_r0x0012d67a:
  uVar19 = uVar19 + 1;
  lVar21 = lVar21 + -8;
  if (uVar14 >> 3 == uVar19) goto code_r0x0012d686;
  goto LAB_0012d66d;
code_r0x0012d686:
  puVar11 = puVar11 + -lVar21;
LAB_0012d747:
  uVar14 = uVar14 & 7;
  uVar19 = uVar20;
  if (uVar14 != 0) {
    uVar17 = uVar20 | uVar14;
    do {
      uVar19 = uVar20;
      if (input_buffer[uVar20 + uVar26 + (uVar23 & 0x7fffffffffffffff)] != *puVar11) break;
      puVar11 = puVar11 + 1;
      uVar20 = uVar20 + 1;
      uVar14 = uVar14 - 1;
      uVar19 = uVar17;
    } while (uVar14 != 0);
  }
LAB_0012d6a4:
  uVar19 = uVar19 + uVar26;
  iVar3 = bcmp(input_buffer + (uVar23 & 0x7fffffffffffffff),puVar8,uVar19);
  if (iVar3 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (0x7f < uVar19) {
    puVar2 = local_270->forest_;
    puVar2[local_240] = puVar2[(uVar25 & uVar4) * 2];
    puVar2[local_238] = puVar2[(uVar25 & uVar4) * 2 + 1];
    goto LAB_0012d58f;
  }
  uVar26 = (uVar25 & uVar4) * 2;
  puVar2 = local_270->forest_;
  if (puVar8[uVar19] < (input_buffer + (uVar23 & 0x7fffffffffffffff))[uVar19]) {
    puVar2[local_240] = (uint32_t)uVar25;
    uVar26 = uVar26 | 1;
    uVar18 = uVar19;
    local_240 = uVar26;
  }
  else {
    puVar2[local_238] = (uint32_t)uVar25;
    uVar6 = uVar19;
    local_238 = uVar26;
  }
  uVar25 = (ulong)puVar2[uVar26];
  if (uVar23 == uVar25) goto LAB_0012d56d;
  goto LAB_0012d5e8;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}